

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_drawSubsectors(void)

{
  double *pdVar1;
  F3DFloor *pFVar2;
  secplane_t *psVar3;
  sector_t *psVar4;
  DVector3 *pDVar5;
  TVector2<float> *pTVar6;
  int iVar7;
  undefined4 extraout_var;
  secplane_t *plane;
  lightlist_t *plVar8;
  FDynamicColormap **ppFVar9;
  FDynamicColormap *pFVar10;
  int iVar11;
  FTexture *pFVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  DVector3 *pDVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 uVar25;
  int floorlight;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  mpoint_t pt;
  double local_260;
  DAngle local_258;
  int ceilinglight;
  sector_t_conflict tempsec;
  sector_t_conflict *sector;
  
  if (AM_drawSubsectors()::points == '\0') {
    AM_drawSubsectors();
  }
  local_2a0 = scale_mtof;
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x10])();
  if (0 < numsubsectors) {
    lVar17 = 0;
    do {
      if ((((subsectors[lVar17].flags & 4U) == 0) &&
          ((((subsectors[lVar17].flags & 2U) != 0 &&
            (((subsectors[lVar17].render_sector)->MoreFlags & 0x100) == 0)) || (am_cheat.Value != 0)
           ))) && (((am_portaloverlay.Value != true ||
                    (iVar7 = (subsectors[lVar17].render_sector)->PortalGroup, iVar7 == 0)) ||
                   (iVar7 == MapPortalGroup)))) {
        TArray<TVector2<float>,_TVector2<float>_>::Resize
                  (&AM_drawSubsectors::points,subsectors[lVar17].numlines);
        if (subsectors[lVar17].numlines != 0) {
          lVar18 = 0;
          uVar13 = 0;
          do {
            pdVar1 = *(double **)((long)&(subsectors[lVar17].firstline)->v1 + lVar18);
            pt.x = *pdVar1;
            pt.y = pdVar1[1];
            if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
              AM_rotatePoint(&pt.x,&pt.y);
            }
            pTVar6 = AM_drawSubsectors::points.Array;
            AM_drawSubsectors::points.Array[uVar13].X =
                 (float)((pt.x - m_x) * local_2a0 + (double)f_x);
            pTVar6[uVar13].Y = (float)(((double)f_h - (pt.y - m_y) * local_2a0) + (double)f_y);
            uVar13 = uVar13 + 1;
            lVar18 = lVar18 + 0x30;
          } while (uVar13 < subsectors[lVar17].numlines);
        }
        iVar7 = (*Renderer->_vptr_FRenderer[0x14])
                          (Renderer,subsectors[lVar17].render_sector,&tempsec,&floorlight,
                           &ceilinglight,0);
        sector = (sector_t_conflict *)CONCAT44(extraout_var,iVar7);
        uVar25 = 0x8000000000000000;
        local_2d8 = -sector->planes[0].xform.xOffs;
        local_2d0 = sector->planes[0].xform.yOffs + sector->planes[0].xform.baseyOffs;
        dVar24 = -(sector->planes[0].xform.baseAngle.Degrees + sector->planes[0].xform.Angle.Degrees
                  );
        iVar7 = sector->planes[0].Texture.texnum;
        local_2b0 = sector->planes[0].xform.xScale;
        local_2a8 = sector->planes[0].xform.yScale;
        if ((sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0) {
          ppFVar9 = &sector->ColorMap;
        }
        else {
          if ((&DAT_017e5fc8)[(long)consoleplayer * 0x54] == 0) {
LAB_00345c87:
            pDVar16 = (DVector3 *)&sector->centerspot;
            pDVar5 = (DVector3 *)&sector->centerspot;
          }
          else {
            if ((*(byte *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0x20) & 0x20) != 0) {
              (&DAT_017e5fc8)[(long)consoleplayer * 0x54] = 0;
              goto LAB_00345c87;
            }
            if (sector != *(sector_t_conflict **)
                           ((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0x130)) goto LAB_00345c87;
            pDVar16 = &ViewPos;
            pDVar5 = &ViewPos;
          }
          plane = &sector->floorplane;
          uVar13 = (ulong)(sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          if (uVar13 != 0) {
            dVar20 = pDVar16->X;
            dVar21 = pDVar5->Y;
            uVar14 = 0;
            do {
              pFVar2 = (sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                       [uVar14];
              iVar15 = 10;
              if (((pFVar2->flags & 0x1009) == 9) && (pFVar2->alpha != 0)) {
                psVar3 = (pFVar2->top).plane;
                dVar22 = ((psVar3->normal).Y * dVar21 + (psVar3->normal).X * dVar20 + psVar3->D) *
                         psVar3->negiC;
                if ((dVar22 <= ((sector->ceilingplane).normal.Y * dVar21 +
                               (sector->ceilingplane).normal.X * dVar20 + (sector->ceilingplane).D)
                               * (sector->ceilingplane).negiC) &&
                   ((iVar15 = 8,
                    ((sector->floorplane).normal.Y * dVar21 +
                    (sector->floorplane).normal.X * dVar20 + (sector->floorplane).D) *
                    (sector->floorplane).negiC <= dVar22 && (iVar15 = 0, dVar22 < ViewPos.Z)))) {
                  psVar4 = (pFVar2->top).model;
                  iVar7 = ((pFVar2->top).texture)->texnum;
                  bVar19 = (pFVar2->flags >> 0xd & 1) == 0;
                  dVar24 = -(psVar4->planes[bVar19].xform.baseAngle.Degrees +
                            psVar4->planes[bVar19].xform.Angle.Degrees);
                  local_2b0 = psVar4->planes[bVar19].xform.xScale;
                  local_2a8 = psVar4->planes[bVar19].xform.yScale;
                  local_2d8 = -psVar4->planes[bVar19].xform.xOffs;
                  local_2d0 = psVar4->planes[bVar19].xform.yOffs +
                              psVar4->planes[bVar19].xform.baseyOffs;
                  iVar15 = 8;
                  plane = psVar3;
                }
              }
            } while (((iVar15 == 10) || (iVar15 == 0)) && (uVar14 = uVar14 + 1, uVar13 != uVar14));
          }
          uStack_2c0 = 0x8000000000000000;
          local_2c8 = dVar24;
          plVar8 = P_GetPlaneLight(sector,plane,false);
          floorlight = (int)*plVar8->p_lightlevel;
          ppFVar9 = &plVar8->extra_colormap;
          dVar24 = local_2c8;
          uVar25 = uStack_2c0;
        }
        if (iVar7 != skyflatnum.texnum) {
          pFVar10 = *ppFVar9;
          local_2c8 = dVar24;
          uStack_2c0 = uVar25;
          if ((dVar24 != 0.0) || (NAN(dVar24))) {
            local_258.Degrees = dVar24;
            AM_rotate(&local_2d8,&local_2d0,&local_258);
          }
          if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
            local_2c8 = (local_2c8 + 90.0) -
                        *(double *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0xb0);
            AM_rotatePoint(&local_2d8,&local_2d0);
          }
          dVar23 = (double)f_x;
          dVar24 = local_2d8 - m_x;
          dVar22 = (double)f_y;
          dVar20 = (double)f_h;
          dVar21 = local_2d0 - m_y;
          if ((subsectors[lVar17].flags & 2) == 0) {
            iVar11 = 0xff - pFVar10->Desaturate;
            iVar15 = 0x102 - pFVar10->Desaturate;
            if (-1 < iVar11) {
              iVar15 = iVar11;
            }
            pFVar10 = GetSpecialLights((PalEntry)
                                       ((pFVar10->Color).field_0.field_0.b + 0xa0 >> 1 |
                                       (uint)(pFVar10->Color).field_0.field_0.g * 0x80 + 0x6400 &
                                       0xff00 | (uint)(pFVar10->Color).field_0.field_0.r * 0x8000 +
                                                0x7f8000 & 0xff0000),
                                       (PalEntry)(pFVar10->Fade).field_0.field_0,
                                       0xff - (iVar15 >> 2));
            iVar15 = floorlight + 0xbc7;
            if (-1 < floorlight + 3000) {
              iVar15 = floorlight + 3000;
            }
            floorlight = iVar15 >> 4;
          }
          uVar13 = (ulong)iVar7;
          if (uVar13 < TexMan.Textures.Count) {
            pFVar12 = TexMan.Textures.Array[TexMan.Translation.Array[uVar13]].Texture;
          }
          else {
            pFVar12 = (FTexture *)0x0;
          }
          if ((pFVar12 != (FTexture *)0x0) && (pFVar12->UseType != '\r')) {
            if (uVar13 < TexMan.Textures.Count) {
              pFVar12 = TexMan.Textures.Array[TexMan.Translation.Array[uVar13]].Texture;
            }
            else {
              pFVar12 = (FTexture *)0x0;
            }
            local_260 = local_2c8;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x12])
                      (dVar24 * local_2a0 + dVar23,(dVar20 - dVar21 * local_2a0) + dVar22,
                       local_2a0 / local_2b0,local_2a0 / local_2a8,screen,pFVar12,
                       AM_drawSubsectors::points.Array,(ulong)AM_drawSubsectors::points.Count,
                       &local_260,pFVar10,(ulong)(uint)floorlight,(ulong)(uint)(f_h + f_y));
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < numsubsectors);
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x11])();
  return;
}

Assistant:

void AM_drawSubsectors()
{
	static TArray<FVector2> points;
	double scale = scale_mtof;
	DAngle rotation;
	sector_t tempsec;
	int floorlight, ceilinglight;
	double scalex, scaley;
	double originx, originy;
	FDynamicColormap *colormap;
	mpoint_t originpt;

	screen->StartSimplePolys();
	for (int i = 0; i < numsubsectors; ++i)
	{
		if (subsectors[i].flags & SSECF_POLYORG)
		{
			continue;
		}

		if ((!(subsectors[i].flags & SSECF_DRAWN) || (subsectors[i].render_sector->MoreFlags & SECF_HIDDEN)) && am_cheat == 0)
		{
			continue;
		}

		if (am_portaloverlay && subsectors[i].render_sector->PortalGroup != MapPortalGroup && subsectors[i].render_sector->PortalGroup != 0)
		{
			continue;
		}

		// Fill the points array from the subsector.
		points.Resize(subsectors[i].numlines);
		for (DWORD j = 0; j < subsectors[i].numlines; ++j)
		{
			mpoint_t pt = { subsectors[i].firstline[j].v1->fX(),
							subsectors[i].firstline[j].v1->fY() };
			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&pt.x, &pt.y);
			}
			points[j].X = float(f_x + ((pt.x - m_x) * scale));
			points[j].Y = float(f_y + (f_h - (pt.y - m_y) * scale));
		}
		// For lighting and texture determination
		sector_t *sec = Renderer->FakeFlat(subsectors[i].render_sector, &tempsec, &floorlight, &ceilinglight, false);
		// Find texture origin.
		originpt.x = -sec->GetXOffset(sector_t::floor);
		originpt.y = sec->GetYOffset(sector_t::floor);
		rotation = -sec->GetAngle(sector_t::floor);
		// Coloring for the polygon
		colormap = sec->ColorMap;

		FTextureID maptex = sec->GetTexture(sector_t::floor);

		scalex = sec->GetXScale(sector_t::floor);
		scaley = sec->GetYScale(sector_t::floor);

		if (sec->e->XFloor.ffloors.Size())
		{
			secplane_t *floorplane = &sec->floorplane;

			// Look for the highest floor below the camera viewpoint.
			// Check the center of the subsector's sector. Do not check each
			// subsector separately because that might result in different planes for
			// different subsectors of the same sector which is not wanted here.
			// (Make the comparison in floating point to avoid overflows and improve performance.)
			double secx;
			double secy;
			double seczb, seczt;
			double cmpz = ViewPos.Z;

			if (players[consoleplayer].camera && sec == players[consoleplayer].camera->Sector)
			{
				// For the actual camera sector use the current viewpoint as reference.
				secx = ViewPos.X;
				secy = ViewPos.Y;
			}
			else
			{
				secx = sec->centerspot.X;
				secy = sec->centerspot.Y;
			}
			seczb = floorplane->ZatPoint(secx, secy);
			seczt = sec->ceilingplane.ZatPoint(secx, secy);

			for (unsigned int i = 0; i < sec->e->XFloor.ffloors.Size(); ++i)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (rover->flags & FF_FOG) continue;
				if (!(rover->flags & FF_RENDERPLANES)) continue;
				if (rover->alpha == 0) continue;
				double roverz = rover->top.plane->ZatPoint(secx, secy);
				// Ignore 3D floors that are above or below the sector itself:
				// they are hidden. Since 3D floors are sorted top to bottom,
				// if we get below the sector floor, we can stop.
				if (roverz > seczt) continue;
				if (roverz < seczb) break;
				if (roverz < cmpz)
				{
					maptex = *(rover->top.texture);
					floorplane = rover->top.plane;
					sector_t *model = rover->top.model;
					int selector = (rover->flags & FF_INVERTPLANES) ? sector_t::floor : sector_t::ceiling;
					rotation = -model->GetAngle(selector);
					scalex = model->GetXScale(selector);
					scaley = model->GetYScale(selector);
					originpt.x = -model->GetXOffset(selector);
					originpt.y = model->GetYOffset(selector);
					break;
				}
			}

			lightlist_t *light = P_GetPlaneLight(sec, floorplane, false);
			floorlight = *light->p_lightlevel;
			colormap = light->extra_colormap;
		}
		if (maptex == skyflatnum)
		{
			continue;
		}

		// Apply the floor's rotation to the texture origin.
		if (rotation != 0)
		{
			AM_rotate(&originpt.x, &originpt.y, rotation);
		}
		// Apply the automap's rotation to the texture origin.
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			rotation = rotation + 90. - players[consoleplayer].camera->Angles.Yaw;
			AM_rotatePoint(&originpt.x, &originpt.y);
		}
		originx = f_x + ((originpt.x - m_x) * scale);
		originy = f_y + (f_h - (originpt.y - m_y) * scale);

		// If this subsector has not actually been seen yet (because you are cheating
		// to see it on the map), tint and desaturate it.
		if (!(subsectors[i].flags & SSECF_DRAWN))
		{
			colormap = GetSpecialLights(
				MAKERGB(
					(colormap->Color.r + 255) / 2,
					(colormap->Color.g + 200) / 2,
					(colormap->Color.b + 160) / 2),
				colormap->Fade,
				255 - (255 - colormap->Desaturate) / 4);
			floorlight = (floorlight + 200 * 15) / 16;
		}

		// Draw the polygon.
		FTexture *pic = TexMan(maptex);
		if (pic != NULL && pic->UseType != FTexture::TEX_Null)
		{
			screen->FillSimplePoly(TexMan(maptex),
				&points[0], points.Size(),
				originx, originy,
				scale / scalex,
				scale / scaley,
				rotation,
				colormap,
				floorlight,
				f_y + f_h
				);
		}
	}
	screen->FinishSimplePolys();
}